

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_modarith(_func_mp_int_ptr_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_modarith)

{
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *pmVar1;
  mp_int *out;
  size_t i;
  mp_int *modulus;
  mp_int *exponent;
  mp_int *base;
  _func_mp_int_ptr_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_modarith_local;
  
  x = mp_new(0x100);
  x_00 = mp_new(0x100);
  x_01 = mp_new(0x100);
  out = (mp_int *)0x0;
  while( true ) {
    pmVar1 = (mp_int *)(*looplimit)(8);
    if (pmVar1 <= out) break;
    mp_random_fill(x);
    mp_random_fill(x_00);
    mp_random_fill(x_01);
    mp_set_bit(x_01,0,1);
    log_start();
    pmVar1 = (*mp_modarith)(x,x_00,x_01);
    log_end();
    mp_free(pmVar1);
    out = (mp_int *)((long)&out->nw + 1);
  }
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_modarith(
    mp_int *(*mp_modarith)(mp_int *x, mp_int *y, mp_int *modulus))
{
    mp_int *base = mp_new(256);
    mp_int *exponent = mp_new(256);
    mp_int *modulus = mp_new(256);

    for (size_t i = 0; i < looplimit(8); i++) {
        mp_random_fill(base);
        mp_random_fill(exponent);
        mp_random_fill(modulus);
        mp_set_bit(modulus, 0, 1);    /* we only support odd moduli */

        log_start();
        mp_int *out = mp_modarith(base, exponent, modulus);
        log_end();

        mp_free(out);
    }

    mp_free(base);
    mp_free(exponent);
    mp_free(modulus);
}